

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BPlusTree.h
# Opt level: O3

void __thiscall BPlusTree<int>::loose_insert(BPlusTree<int> *this,int *entry)

{
  Array<int> *data;
  int *piVar1;
  BPlusTree<int> **ppBVar2;
  int iVar3;
  size_t index;
  
  piVar1 = find(this,entry);
  if (piVar1 == (int *)0x0) {
    data = &this->data;
    iVar3 = b_array::first_ge<int>(data,this->data_size,entry);
    index = (size_t)iVar3;
    if ((this->subset_size != 0) &&
       (piVar1 = b_array::Array<int>::operator[](data,index), *piVar1 != *entry)) {
      ppBVar2 = b_array::Array<BPlusTree<int>_*>::operator[](&this->subset,index);
      loose_insert(*ppBVar2,entry);
      ppBVar2 = b_array::Array<BPlusTree<int>_*>::operator[](&this->subset,index);
      if ((*ppBVar2)->data_size < 3) {
        return;
      }
      fix_excess(this,iVar3);
      return;
    }
    piVar1 = b_array::Array<int>::operator[](data,index);
    if (*piVar1 != *entry) {
      b_array::insert_item<int>(data,index,&this->data_size,entry);
      return;
    }
  }
  else {
    iVar3 = *entry;
    if (this->duplicates_allowed == true) {
      iVar3 = iVar3 + *piVar1;
    }
    *piVar1 = iVar3;
  }
  return;
}

Assistant:

void BPlusTree<T>::loose_insert(const T& entry) {
    // check if thing is already here
    T* item = find(entry);
    // assuming the duplicates allowed flag is for multimap to call +=
    if (item != nullptr) {
        if (!duplicates_allowed)
            *item = entry;
        else
            *item += entry;
        return;
    }
    
    // it's not here, put it somewhere
    int index = b_array::first_ge(data, data_size, entry);
    if (!is_leaf() && data[index] != entry)
        subset[index]->loose_insert(entry);
    else {
        if (data[index] != entry)
            b_array::insert_item(data, index, data_size, entry);
        return;
    }
    if (subset[index]->data_size > MAXIMUM) {
        fix_excess(index);
    }
}